

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O2

void xor_test(void)

{
  _Bool _Var1;
  bitset_container_t *src_1;
  bitset_container_t *src_2;
  bitset_container_t *container2;
  bitset_container_t *dst;
  size_t x;
  ulong uVar2;
  
  src_1 = bitset_container_create();
  src_2 = bitset_container_create();
  container2 = bitset_container_create();
  dst = bitset_container_create();
  _assert_true((unsigned_long)src_1,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xc9);
  _assert_true((unsigned_long)src_2,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xca);
  _assert_true((unsigned_long)container2,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xcb);
  _assert_true((unsigned_long)dst,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xcc);
  for (uVar2 = 0; uVar2 < 0x10000; uVar2 = uVar2 + 3) {
    bitset_container_set(src_1,(uint16_t)uVar2);
    bitset_container_set(container2,(uint16_t)uVar2);
  }
  for (uVar2 = 0; uVar2 < 0x10000; uVar2 = uVar2 + 0x3e) {
    bitset_container_set(src_2,(uint16_t)uVar2);
    bitset_container_set(container2,(uint16_t)uVar2);
  }
  for (uVar2 = 0; uVar2 < 0x10000; uVar2 = uVar2 + 0xba) {
    bitset_container_remove(container2,(uint16_t)uVar2);
  }
  bitset_container_xor(src_1,src_2,dst);
  _Var1 = bitset_container_equals(dst,container2);
  _assert_true((ulong)_Var1,"bitset_container_equals(TMP, BI)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0xde);
  bitset_container_free(src_1);
  bitset_container_free(src_2);
  bitset_container_free(container2);
  bitset_container_free(dst);
  return;
}

Assistant:

DEFINE_TEST(xor_test) {
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BI = bitset_container_create();
    bitset_container_t* TMP = bitset_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 3) {
        bitset_container_set(B1, x);
        bitset_container_set(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        bitset_container_set(B2, x);
        bitset_container_set(BI, x);
    }

    for (size_t x = 0; x < (1 << 16); x += 62 * 3) {
        bitset_container_remove(BI, x);
    }

    bitset_container_xor(B1, B2, TMP);
    assert_true(bitset_container_equals(TMP, BI));

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(BI);
    bitset_container_free(TMP);
}